

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O0

void Mf_ManComputeCuts(Mf_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pObj;
  char *local_28;
  int local_14;
  int i;
  Mf_Man_t *p_local;
  
  for (local_14 = 0; local_14 < p->pGia->nObjs; local_14 = local_14 + 1) {
    pObj = Gia_ManObj(p->pGia,local_14);
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 != 0) {
      Mf_ObjMergeOrder(p,local_14);
    }
  }
  Mf_ManSetMapRefs(p);
  if (p->fUseEla == 0) {
    local_28 = "Delay";
    if (p->Iter != 0) {
      local_28 = "Area ";
    }
  }
  else {
    local_28 = "Ela  ";
  }
  Mf_ManPrintStats(p,local_28);
  return;
}

Assistant:

void Mf_ManComputeCuts( Mf_Man_t * p )
{
    int i;
    Gia_ManForEachAndId( p->pGia, i )
        Mf_ObjMergeOrder( p, i );
    Mf_ManSetMapRefs( p );
    Mf_ManPrintStats( p, (char *)(p->fUseEla ? "Ela  " : (p->Iter ? "Area " : "Delay")) );
}